

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytes.c
# Opt level: O0

int main(int argc,char **argv)

{
  double vd;
  undefined4 local_4a8;
  cf_int32_t vi;
  cf_uint8_t buf [1024];
  cf_byte_writer_t w;
  cf_byte_reader_t r;
  char **argv_local;
  int argc_local;
  
  buf._1016_8_ = &local_4a8;
  local_4a8 = 0x4d2;
  if ((_vi == 1.1111) && (!NAN(_vi))) {
    return 0;
  }
  __assert_fail("vd == 1.1111",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/tests/test_bytes.c"
                ,0x14,"int main(int, const char **)");
}

Assistant:

int main(int argc, char const *argv[]) {
    cf_byte_reader_t r;
    cf_byte_writer_t w;
    cf_uint8_t buf[1024];
    cf_byte_writer_init(&w, buf, 1024);
    cf_byte_writer_put_i32(&w, 1234);
    cf_byte_writer_put_double(&w, 1.1111);
    
    cf_byte_reader_init(&r, cf_byte_writer_data(&w), cf_byte_writer_length(&w));
    cf_assert(cf_byte_reader_remaining(&r) == sizeof(cf_int32_t) + sizeof(double));
    cf_int32_t vi = 0;
    double vd = 0.0;
    cf_assert(cf_byte_reader_get_i32(&r, &vi) == CF_TRUE);
    cf_assert(vi == 1234);
    cf_assert(cf_byte_reader_get_double(&r, &vd) == CF_TRUE);
    cf_assert(vd == 1.1111);
    cf_assert(cf_byte_reader_remaining(&r) == 0);
    return 0;
}